

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Zp_field.h
# Opt level: O2

int Gudhi::persistence_fields::Zp_field_element<7U,_unsigned_int,_void>::_get_inverse
              (Element_conflict element)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int A;
  int iVar5;
  
  iVar2 = 0;
  iVar3 = 1;
  uVar1 = 7;
  while( true ) {
    uVar4 = uVar1;
    iVar5 = iVar2;
    if ((int)element < 2) break;
    iVar2 = iVar3 - (element / uVar4) * iVar5;
    iVar3 = iVar5;
    uVar1 = element % uVar4;
    element = uVar4;
  }
  iVar2 = iVar3 + 7;
  if (-1 < iVar3) {
    iVar2 = iVar3;
  }
  return iVar2;
}

Assistant:

static int _get_inverse(Element element) {
    // to solve: Ax + My = 1
    int M = characteristic;
    int A = element;
    int y = 0, x = 1;
    // extended euclidean division
    while (A > 1) {
      int quotient = A / M;
      int temp = M;

      M = A % M, A = temp;
      temp = y;

      y = x - quotient * y;
      x = temp;
    }

    if (x < 0) x += characteristic;

    return x;
  }